

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O3

void agg::arc_to_bezier(double cx,double cy,double rx,double ry,double start_angle,
                       double sweep_angle,double *curve)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double px [4];
  double local_88 [6];
  double local_58;
  double local_48;
  double local_38;
  double local_28 [4];
  
  dVar7 = sweep_angle * 0.5;
  local_88[4] = cx;
  local_58 = rx;
  local_48 = cy;
  local_38 = ry;
  dVar8 = cos(dVar7);
  local_28[3] = sin(dVar7);
  local_88[1] = ((1.0 - dVar8) * 4.0) / 3.0;
  local_28[2] = local_28[3] - (dVar8 * local_88[1]) / local_28[3];
  local_88[1] = local_88[1] + dVar8;
  local_28[0] = -local_28[3];
  local_28[1] = -local_28[2];
  local_88[0] = dVar8;
  local_88[2] = local_88[1];
  local_88[3] = dVar8;
  dVar8 = sin(dVar7 + start_angle);
  dVar7 = cos(dVar7 + start_angle);
  lVar6 = 0;
  do {
    dVar2 = *(double *)((long)local_88 + lVar6);
    dVar3 = *(double *)((long)local_88 + lVar6 + 8);
    dVar4 = *(double *)((long)local_28 + lVar6);
    dVar5 = *(double *)((long)local_28 + lVar6 + 8);
    pdVar1 = (double *)((long)curve + lVar6 * 2 + 0x10);
    *pdVar1 = (dVar3 * dVar7 - dVar8 * dVar5) * local_58 + local_88[4];
    pdVar1[1] = (dVar3 * dVar8 + dVar5 * dVar7) * local_38 + local_48;
    pdVar1 = (double *)((long)curve + lVar6 * 2);
    *pdVar1 = (dVar2 * dVar7 - dVar8 * dVar4) * local_58 + local_88[4];
    pdVar1[1] = (dVar2 * dVar8 + dVar4 * dVar7) * local_38 + local_48;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x20);
  return;
}

Assistant:

void arc_to_bezier(double cx, double cy, double rx, double ry, 
                       double start_angle, double sweep_angle,
                       double* curve)
    {
        double x0 = cos(sweep_angle / 2.0);
        double y0 = sin(sweep_angle / 2.0);
        double tx = (1.0 - x0) * 4.0 / 3.0;
        double ty = y0 - tx * x0 / y0;
        double px[4];
        double py[4];
        px[0] =  x0;
        py[0] = -y0;
        px[1] =  x0 + tx;
        py[1] = -ty;
        px[2] =  x0 + tx;
        py[2] =  ty;
        px[3] =  x0;
        py[3] =  y0;

        double sn = sin(start_angle + sweep_angle / 2.0);
        double cs = cos(start_angle + sweep_angle / 2.0);

        unsigned i;
        for(i = 0; i < 4; i++)
        {
            curve[i * 2]     = cx + rx * (px[i] * cs - py[i] * sn);
            curve[i * 2 + 1] = cy + ry * (px[i] * sn + py[i] * cs);
        }
    }